

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChCollisionModelBullet.cpp
# Opt level: O1

bool __thiscall
chrono::collision::ChCollisionModelBullet::Add2Dpath
          (ChCollisionModelBullet *this,shared_ptr<chrono::ChMaterialSurface> *material,
          shared_ptr<chrono::geometry::ChLinePath> *mpath,ChVector<double> *pos,
          ChMatrix33<double> *rot,double mthickness)

{
  undefined1 auVar1 [16];
  element_type *peVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  long *plVar4;
  long *plVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> this_00;
  undefined8 uVar6;
  bool bVar7;
  pointer psVar8;
  long lVar9;
  ChCollisionShapeBullet *pCVar10;
  cbt2DsegmentShape *this_01;
  ulong uVar11;
  cbt2DarcShape *pcVar12;
  ChException *pCVar13;
  ulong uVar14;
  long lVar15;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_02;
  shared_ptr<chrono::geometry::ChLinePath> *psVar16;
  float mzthickness;
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  ChVector<double> dir_next;
  ChVector<double> dir_prev;
  cbtVector3 pa;
  cbtVector3 pb;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1c0;
  double local_1a8;
  double dStack_1a0;
  double local_198;
  double local_188;
  double dStack_180;
  double local_178;
  undefined1 local_168 [8];
  double dStack_160;
  double local_158;
  undefined1 local_148 [8];
  double dStack_140;
  double local_138;
  double local_130;
  ChVector<double> *local_128;
  ChMatrix33<double> *local_120;
  shared_ptr<chrono::ChMaterialSurface> *local_118;
  shared_ptr<chrono::geometry::ChLinePath> *local_110;
  shared_ptr<chrono::ChMaterialSurface> local_108;
  shared_ptr<chrono::ChMaterialSurface> local_f8;
  shared_ptr<chrono::ChMaterialSurface> local_e8;
  double local_d8;
  undefined8 uStack_d0;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  double local_48;
  undefined8 uStack_40;
  
  local_128 = pos;
  local_120 = rot;
  local_118 = material;
  (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x24])(0);
  peVar2 = (mpath->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  psVar8 = (peVar2->lines).
           super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((peVar2->lines).
      super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != psVar8) {
    mzthickness = (float)mthickness;
    lVar15 = 8;
    uVar14 = 0;
    local_110 = mpath;
    do {
      lVar9 = *(long *)((long)psVar8 + lVar15 + -8);
      p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                ((long)&(psVar8->
                        super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>).
                        _M_ptr + lVar15);
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
        }
      }
      if (lVar9 == 0) {
        lVar9 = 0;
      }
      else {
        lVar9 = __dynamic_cast(lVar9,&geometry::ChLine::typeinfo,&geometry::ChLineSegment::typeinfo,
                               0);
      }
      local_1c0 = p_Var3;
      if (lVar9 == 0) {
        local_1c0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      }
      if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (lVar9 != 0)) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          UNLOCK();
          local_1c0 = p_Var3;
        }
        else {
          p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          local_1c0 = p_Var3;
        }
      }
      if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
      }
      if (lVar9 == 0) {
        psVar8 = (((local_110->
                   super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->lines).
                 super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        lVar9 = *(long *)((long)psVar8 + lVar15 + -8);
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(psVar8->
                          super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + lVar15);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        if (lVar9 == 0) {
          lVar9 = 0;
        }
        else {
          lVar9 = __dynamic_cast(lVar9,&geometry::ChLine::typeinfo,&geometry::ChLineArc::typeinfo,0)
          ;
        }
        this_02 = p_Var3;
        if (lVar9 == 0) {
          this_02 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        }
        if ((p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) && (lVar9 != 0)) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
            this_02 = p_Var3;
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            this_02 = p_Var3;
          }
        }
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
        if (lVar9 == 0) {
          pCVar13 = (ChException *)__cxa_allocate_exception(0x28);
          local_a8._M_dataplus._M_p = (pointer)&local_a8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_a8,
                     "Error! Add2Dpath: ChLinePath must contain only ChLineArc and/or ChLineSegment."
                     ,"");
          ChException::ChException(pCVar13,&local_a8);
          __cxa_throw(pCVar13,&ChException::typeinfo,ChException::~ChException);
        }
        if (((*(double *)(lVar9 + 0x30) != 0.0) || (*(double *)(lVar9 + 0x38) != 0.0)) ||
           (NAN(*(double *)(lVar9 + 0x38)))) {
          pCVar13 = (ChException *)__cxa_allocate_exception(0x28);
          local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_88,
                     "Error! Add2Dpath: a sub arc of ChLinePath not parallel to XY plane!","");
          ChException::ChException(pCVar13,&local_88);
          __cxa_throw(pCVar13,&ChException::typeinfo,ChException::~ChException);
        }
        local_d8 = *(double *)(lVar9 + 0x50);
        local_130 = *(double *)(lVar9 + 0x58);
        uStack_d0 = 0;
        local_48 = local_d8 + -1e-07;
        uStack_40 = 0;
        auVar18._8_8_ = 0;
        auVar18._0_8_ = local_d8 - local_130;
        uVar6 = vcmpsd_avx512f(auVar18,ZEXT816(0x401921fb54442d18),0);
        bVar7 = (bool)((byte)uVar6 & 1);
        pCVar10 = (ChCollisionShapeBullet *)::operator_new(0x28);
        local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_118->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
        local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (local_118->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ChCollisionShapeBullet::ChCollisionShapeBullet(pCVar10,PATH2D,&local_f8);
        if (local_f8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_f8.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        pcVar12 = (cbt2DarcShape *)cbtAlignedAllocInternal(0x60,0x10);
        cbt2DarcShape::cbt2DarcShape
                  (pcVar12,(float)*(double *)(lVar9 + 0x10),(float)*(double *)(lVar9 + 0x18),
                   (float)*(double *)(lVar9 + 0x48),
                   (float)(double)((ulong)bVar7 * (long)local_48 + (ulong)!bVar7 * (long)local_d8),
                   (float)local_130,*(bool *)(lVar9 + 0x60),mzthickness);
        pCVar10->m_bt_shape = (cbtCollisionShape *)pcVar12;
        (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])();
        (*(pcVar12->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
          _vptr_cbtCollisionShape[0xb])(pcVar12);
        injectShape(this,local_128,local_120,pCVar10);
        if (this_02 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_02);
        }
      }
      else {
        if ((*(double *)(lVar9 + 0x20) != *(double *)(lVar9 + 0x38)) ||
           (NAN(*(double *)(lVar9 + 0x20)) || NAN(*(double *)(lVar9 + 0x38)))) {
          pCVar13 = (ChException *)__cxa_allocate_exception(0x28);
          local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_68,
                     "Error! Add2Dpath: sub segment of ChLinePath not parallel to XY plane!","");
          ChException::ChException(pCVar13,&local_68);
          __cxa_throw(pCVar13,&ChException::typeinfo,ChException::~ChException);
        }
        local_168._4_4_ = (float)*(double *)(lVar9 + 0x18);
        local_168._0_4_ = (float)*(double *)(lVar9 + 0x10);
        dStack_160 = 0.0;
        local_148._4_4_ = (float)*(double *)(lVar9 + 0x30);
        local_148._0_4_ = (float)*(double *)(lVar9 + 0x28);
        dStack_140 = 0.0;
        pCVar10 = (ChCollisionShapeBullet *)::operator_new(0x28);
        local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (local_118->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr;
        local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi =
             (local_118->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>).
             _M_refcount._M_pi;
        if (local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi)->_M_use_count =
                 (local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                  ._M_refcount._M_pi)->_M_use_count + 1;
          }
        }
        ChCollisionShapeBullet::ChCollisionShapeBullet(pCVar10,PATH2D,&local_e8);
        if (local_e8.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_e8.
                     super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        this_01 = (cbt2DsegmentShape *)cbtAlignedAllocInternal(0x68,0x10);
        cbt2DsegmentShape::cbt2DsegmentShape
                  (this_01,(cbtVector3 *)local_168,(cbtVector3 *)local_148,mzthickness);
        pCVar10->m_bt_shape = (cbtCollisionShape *)this_01;
        (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])();
        (*(this_01->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
          _vptr_cbtCollisionShape[0xb])(this_01);
        injectShape(this,local_128,local_120,pCVar10);
      }
      if (local_1c0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_1c0);
      }
      psVar16 = local_110;
      uVar14 = uVar14 + 1;
      peVar2 = (local_110->
               super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      uVar11 = uVar14;
      if ((ulong)((long)(peVar2->lines).
                        super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(peVar2->lines).
                        super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 4) <= uVar14) {
        (*(peVar2->super_ChLine).super_ChGeometry._vptr_ChGeometry[0x12])(local_168);
        (*(((psVar16->super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr)->super_ChLine).super_ChGeometry._vptr_ChGeometry[0x13])(local_148);
        auVar19._8_8_ = 0;
        auVar19._0_8_ = (dStack_160 - dStack_140) * (dStack_160 - dStack_140);
        auVar30._8_8_ = 0;
        auVar30._0_8_ = (double)local_168 - (double)local_148;
        auVar18 = vfmadd231sd_fma(auVar19,auVar30,auVar30);
        auVar25._8_8_ = 0;
        auVar25._0_8_ = local_158 - local_138;
        auVar18 = vfmadd231sd_fma(auVar18,auVar25,auVar25);
        if (auVar18._0_8_ < 0.0) {
          dVar17 = sqrt(auVar18._0_8_);
        }
        else {
          auVar18 = vsqrtsd_avx(auVar18,auVar18);
          dVar17 = auVar18._0_8_;
        }
        if (dVar17 < 1e-09) {
          uVar11 = 0;
        }
      }
      peVar2 = (psVar16->
               super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar8 = (peVar2->lines).
               super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      if (uVar11 < (ulong)((long)(peVar2->lines).
                                 super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                                 ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4)) {
        plVar4 = *(long **)((long)psVar8 + lVar15 + -8);
        p_Var3 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
                  ((long)&(psVar8->
                          super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>).
                          _M_ptr + lVar15);
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var3->_M_use_count = p_Var3->_M_use_count + 1;
          }
        }
        psVar8 = (((psVar16->
                   super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>).
                  _M_ptr)->lines).
                 super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        plVar5 = *(long **)&psVar8[uVar11].
                            super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
        ;
        this_00._M_pi =
             psVar8[uVar11].super___shared_ptr<chrono::geometry::ChLine,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
            UNLOCK();
          }
          else {
            (this_00._M_pi)->_M_use_count = (this_00._M_pi)->_M_use_count + 1;
          }
        }
        local_168 = (undefined1  [8])0x0;
        dStack_160 = 0.0;
        local_158 = 0.0;
        local_138 = 0.0;
        local_148 = (undefined1  [8])0x0;
        dStack_140 = 0.0;
        local_178 = 0.0;
        local_188 = 0.0;
        dStack_180 = 0.0;
        local_198 = 0.0;
        local_1a8 = 0.0;
        dStack_1a0 = 0.0;
        (**(code **)(*plVar4 + 0x58))(0x3ff0000000000000,plVar4,local_168);
        (**(code **)(*plVar5 + 0x58))(0,plVar5,local_148);
        (**(code **)(*plVar4 + 0x60))(0x3ff0000000000000,plVar4,&local_188);
        (**(code **)(*plVar5 + 0x60))(0,plVar5,&local_1a8);
        auVar20._8_8_ = 0;
        auVar20._0_8_ = local_188;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = dStack_180 * dStack_180;
        auVar18 = vfmadd231sd_fma(auVar26,auVar20,auVar20);
        auVar21._8_8_ = 0;
        auVar21._0_8_ = local_178;
        auVar18 = vfmadd213sd_fma(auVar21,auVar21,auVar18);
        if (auVar18._0_8_ < 0.0) {
          dVar17 = sqrt(auVar18._0_8_);
        }
        else {
          auVar18 = vsqrtsd_avx(auVar18,auVar18);
          dVar17 = auVar18._0_8_;
        }
        if (dVar17 < 2.2250738585072014e-308) {
          local_188 = 1.0;
          dStack_180 = 0.0;
          local_178 = 0.0;
        }
        else {
          dVar17 = 1.0 / dVar17;
          local_188 = dVar17 * local_188;
          dStack_180 = dVar17 * dStack_180;
          local_178 = dVar17 * local_178;
        }
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_1a8;
        auVar27._8_8_ = 0;
        auVar27._0_8_ = dStack_1a0 * dStack_1a0;
        auVar18 = vfmadd231sd_fma(auVar27,auVar22,auVar22);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_198;
        auVar18 = vfmadd213sd_fma(auVar23,auVar23,auVar18);
        if (auVar18._0_8_ < 0.0) {
          dVar17 = sqrt(auVar18._0_8_);
        }
        else {
          auVar18 = vsqrtsd_avx(auVar18,auVar18);
          dVar17 = auVar18._0_8_;
        }
        if (dVar17 < 2.2250738585072014e-308) {
          local_1a8 = 1.0;
          dStack_1a0 = 0.0;
          local_198 = 0.0;
        }
        else {
          dVar17 = 1.0 / dVar17;
          local_1a8 = dVar17 * local_1a8;
          dStack_1a0 = dVar17 * dStack_1a0;
          local_198 = dVar17 * local_198;
        }
        auVar24._8_8_ = 0;
        auVar24._0_8_ = (dStack_160 - dStack_140) * (dStack_160 - dStack_140);
        auVar31._8_8_ = 0;
        auVar31._0_8_ = (double)local_168 - (double)local_148;
        auVar18 = vfmadd231sd_fma(auVar24,auVar31,auVar31);
        auVar28._8_8_ = 0;
        auVar28._0_8_ = local_158 - local_138;
        auVar18 = vfmadd231sd_fma(auVar18,auVar28,auVar28);
        if (auVar18._0_8_ < 0.0) {
          dVar17 = sqrt(auVar18._0_8_);
        }
        else {
          auVar18 = vsqrtsd_avx(auVar18,auVar18);
          dVar17 = auVar18._0_8_;
        }
        if (1e-09 < dVar17) {
          pCVar13 = (ChException *)__cxa_allocate_exception(0x28);
          local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_c8,
                     "Error! Add2Dpath: ChLinePath must contain sequence of connected segments/arcs, with no gaps"
                     ,"");
          ChException::ChException(pCVar13,&local_c8);
          __cxa_throw(pCVar13,&ChException::typeinfo,ChException::~ChException);
        }
        auVar29._8_8_ = 0;
        auVar29._0_8_ = local_188;
        auVar1._8_8_ = 0;
        auVar1._0_8_ = dStack_1a0;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = dStack_180 * local_1a8;
        auVar18 = vfmsub231sd_fma(auVar32,auVar29,auVar1);
        if (auVar18._0_8_ < -1e-09) {
          local_130 = atan2(dStack_180,local_188);
          local_d8 = atan2(dStack_1a0,local_1a8);
          pCVar10 = (ChCollisionShapeBullet *)::operator_new(0x28);
          local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = (local_118->
                 super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
          local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi =
               (local_118->super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
               )._M_refcount._M_pi;
          if (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_108.
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi)->_M_use_count =
                   (local_108.
                    super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi)->_M_use_count + 1;
            }
          }
          ChCollisionShapeBullet::ChCollisionShapeBullet(pCVar10,PATH2D,&local_108);
          if (local_108.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_108.
                       super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          pcVar12 = (cbt2DarcShape *)cbtAlignedAllocInternal(0x60,0x10);
          cbt2DarcShape::cbt2DarcShape
                    (pcVar12,(float)(double)local_168,(float)dStack_160,0.0,
                     (float)(local_130 + 1.5707963267948966),(float)(local_d8 + 1.5707963267948966),
                     false,mzthickness);
          pCVar10->m_bt_shape = (cbtCollisionShape *)pcVar12;
          (*(this->super_ChCollisionModel)._vptr_ChCollisionModel[0x2b])();
          (*(pcVar12->super_cbtConvexInternalShape).super_cbtConvexShape.super_cbtCollisionShape.
            _vptr_cbtCollisionShape[0xb])(pcVar12);
          injectShape(this,local_128,local_120,pCVar10);
        }
        if (this_00._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00._M_pi);
        }
        psVar16 = local_110;
        if (p_Var3 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var3);
        }
      }
      peVar2 = (psVar16->
               super___shared_ptr<chrono::geometry::ChLinePath,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      psVar8 = (peVar2->lines).
               super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar15 = lVar15 + 0x10;
    } while (uVar14 < (ulong)((long)(peVar2->lines).
                                    super__Vector_base<std::shared_ptr<chrono::geometry::ChLine>,_std::allocator<std::shared_ptr<chrono::geometry::ChLine>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)psVar8 >> 4))
    ;
  }
  return true;
}

Assistant:

bool ChCollisionModelBullet::Add2Dpath(std::shared_ptr<ChMaterialSurface> material,
                                       std::shared_ptr<geometry::ChLinePath> mpath,
                                       const ChVector<>& pos,
                                       const ChMatrix33<>& rot,
                                       const double mthickness) {
    // The envelope is not used in this type of collision primitive.
    SetEnvelope(0);

    // if (!mpath.Get_closed())
    //    throw ChException("Error! Add2Dpath requires a CLOSED ChLinePath!");

    for (size_t i = 0; i < mpath->GetSubLinesCount(); ++i) {
        if (auto msegment = std::dynamic_pointer_cast<geometry::ChLineSegment>(mpath->GetSubLineN(i))) {
            if (msegment->pA.z() != msegment->pB.z())
                throw ChException("Error! Add2Dpath: sub segment of ChLinePath not parallel to XY plane!");

            cbtVector3 pa((cbtScalar)msegment->pA.x(), (cbtScalar)msegment->pA.y(), (cbtScalar)0);
            cbtVector3 pb((cbtScalar)msegment->pB.x(), (cbtScalar)msegment->pB.y(), (cbtScalar)0);

            auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::PATH2D, material);
            shape->m_bt_shape = new cbt2DsegmentShape(pa, pb, (cbtScalar)mthickness);
            shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
            injectShape(pos, rot, shape);
        } else if (auto marc = std::dynamic_pointer_cast<geometry::ChLineArc>(mpath->GetSubLineN(i))) {
            if ((marc->origin.rot.e1() != 0) || (marc->origin.rot.e2() != 0))
                throw ChException("Error! Add2Dpath: a sub arc of ChLinePath not parallel to XY plane!");
            double mangle1 = marc->angle1;
            double mangle2 = marc->angle2;
            if (mangle1 - mangle2 == CH_C_2PI)
                mangle1 -= 1e-7;
            auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::PATH2D, material);
            shape->m_bt_shape = new cbt2DarcShape((cbtScalar)marc->origin.pos.x(), (cbtScalar)marc->origin.pos.y(),
                                                  (cbtScalar)marc->radius, (cbtScalar)mangle1, (cbtScalar)mangle2,
                                                  marc->counterclockwise, (cbtScalar)mthickness);
            shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
            injectShape(pos, rot, shape);
        } else {
            throw ChException("Error! Add2Dpath: ChLinePath must contain only ChLineArc and/or ChLineSegment.");
        }

        size_t i_prev = i;
        size_t i_next = i + 1;
        if (i_next >= mpath->GetSubLinesCount())
            if ((mpath->GetEndA() - mpath->GetEndB()).Length() <
                1e-9)        // can't use Get_closed() that is user preference via Set_closed()
                i_next = 0;  // closed path
        if (i_next < mpath->GetSubLinesCount()) {
            std::shared_ptr<geometry::ChLine> mline_prev = mpath->GetSubLineN(i_prev);
            std::shared_ptr<geometry::ChLine> mline_next = mpath->GetSubLineN(i_next);
            ChVector<> pos_prev, pos_next;
            ChVector<> dir_prev, dir_next;
            mline_prev->Evaluate(pos_prev, 1);
            mline_next->Evaluate(pos_next, 0);
            mline_prev->Derive(dir_prev, 1);
            mline_next->Derive(dir_next, 0);
            dir_prev.Normalize();
            dir_next.Normalize();

            // check if connected segments
            if ((pos_prev - pos_next).Length() > 1e-9)
                throw ChException(
                    "Error! Add2Dpath: ChLinePath must contain sequence of connected segments/arcs, with no gaps");

            // insert a 0-radius fillet arc at sharp corners, to allow for sharp-corner vs arc/segment
            if (Vcross(dir_prev, dir_next).z() < -1e-9) {
                double mangle1 = atan2(dir_prev.y(), dir_prev.x()) + CH_C_PI_2;
                double mangle2 = atan2(dir_next.y(), dir_next.x()) + CH_C_PI_2;

                auto shape = new ChCollisionShapeBullet(ChCollisionShape::Type::PATH2D, material);
                shape->m_bt_shape =
                    new cbt2DarcShape((cbtScalar)pos_prev.x(), (cbtScalar)pos_prev.y(), (cbtScalar)0,
                                      (cbtScalar)mangle1, (cbtScalar)mangle2, false, (cbtScalar)mthickness);
                shape->m_bt_shape->setMargin((cbtScalar)GetSuggestedFullMargin());
                injectShape(pos, rot, shape);
                // GetLog() << "convex corner between " << i_next << " and " << i_next << " w.angles: " << mangle1 << "
                // " << mangle2 << "\n";
            } else {
                // GetLog() << "concave corner between " << i_next << " and " << i_next << "\n";
            }
        }
    }

    return true;
}